

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O3

void __thiscall
HawkTracer::client::CallgrindConverter::~CallgrindConverter(CallgrindConverter *this)

{
  pointer pcVar1;
  
  (this->super_Converter)._vptr_Converter = (_func_int **)&PTR__CallgrindConverter_00117c58;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->_events)._M_h);
  pcVar1 = (this->_file_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_file_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_callgrind_header)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_callgrind_header).field_2) {
    operator_delete(pcVar1);
  }
  Converter::~Converter(&this->super_Converter);
  return;
}

Assistant:

CallgrindConverter::~CallgrindConverter()
{
}